

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O1

Slice __thiscall leveldb::anon_unknown_6::TwoLevelIterator::key(TwoLevelIterator *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((char)iVar2 == '\0') {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/two_level_iterator.cc"
                  ,0x21,
                  "virtual Slice leveldb::(anonymous namespace)::TwoLevelIterator::key() const");
  }
  if ((this->data_iter_).valid_ != false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (this->data_iter_).key_;
    }
    __stack_chk_fail();
  }
  __assert_fail("Valid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/iterator_wrapper.h"
                ,0x27,"Slice leveldb::IteratorWrapper::key() const");
}

Assistant:

Slice key() const override {
    assert(Valid());
    return data_iter_.key();
  }